

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

string * __thiscall
node::(anonymous_namespace)::ExternalSignerImpl::getName_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)this + 0x68));
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string getName() override { return m_signer.m_name; }